

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O3

void wasm::
     CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
     ::doStartCatches(RelevantLiveLocalsWalker *self,Expression **currp)

{
  pointer *pppBVar1;
  pointer *pppEVar2;
  Expression *pEVar3;
  BasicBlock *pBVar4;
  pointer pvVar5;
  BasicBlock **__src;
  pointer ppBVar6;
  CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
  *this;
  iterator __position;
  bool bVar7;
  BasicBlock *pBVar8;
  ulong uVar9;
  pointer ppBVar10;
  pointer pvVar11;
  ulong uVar12;
  pointer ppBVar13;
  char *__to;
  ulong uVar14;
  pointer ppBVar15;
  BasicBlock **__x;
  _Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
  *this_00;
  char *pcVar16;
  size_t __n;
  uint local_3c;
  pointer local_38;
  
  __x = &(self->
         super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
         ).
         super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
         .currBasicBlock;
  std::
  vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
  ::push_back(&(self->
               super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
               ).
               super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
               .tryStack,__x);
  pEVar3 = *currp;
  if (pEVar3->_id != TryId) {
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                  ,0x314,"T *wasm::Expression::cast() [T = wasm::Try]");
  }
  pBVar4 = (self->
           super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
           ).
           super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
           .currBasicBlock;
  std::
  vector<std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
  ::emplace_back<>(&(self->
                    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                    ).
                    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                    .processCatchStack);
  pvVar5 = (self->
           super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
           ).
           super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
           .processCatchStack.
           super__Vector_base<std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (*(long *)(pEVar3 + 5) != 0) {
    uVar14 = 1;
    do {
      pBVar8 = startBasicBlock((CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                                *)self);
      ppBVar15 = pvVar5[-1].
                 super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (ppBVar15 ==
          pvVar5[-1].
          super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __src = pvVar5[-1].
                super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
        __n = (long)ppBVar15 - (long)__src;
        if (__n == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar12 = (long)__n >> 3;
        uVar9 = uVar12;
        if (ppBVar15 == __src) {
          uVar9 = 1;
        }
        this_00 = (_Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   *)(uVar9 + uVar12);
        if ((_Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
             *)0xffffffffffffffe < this_00) {
          this_00 = (_Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                     *)0xfffffffffffffff;
        }
        if (CARRY8(uVar9,uVar12)) {
          this_00 = (_Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                     *)0xfffffffffffffff;
        }
        local_38 = std::
                   _Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   ::_M_allocate(this_00,(size_t)__x);
        *(BasicBlock **)((long)local_38 + __n) = pBVar8;
        if (0 < (long)__n) {
          __x = __src;
          memmove(local_38,__src,__n);
        }
        if (__src != (BasicBlock **)0x0) {
          __x = (BasicBlock **)
                ((long)pvVar5[-1].
                       super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__src);
          operator_delete(__src,(ulong)__x);
        }
        pvVar5[-1].
        super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_start = local_38;
        pvVar5[-1].
        super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)local_38 + __n + 8);
        pvVar5[-1].
        super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_38 + (long)this_00;
      }
      else {
        *ppBVar15 = pBVar8;
        pppBVar1 = &pvVar5[-1].
                    super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppBVar1 = *pppBVar1 + 1;
      }
      bVar7 = uVar14 < *(ulong *)(pEVar3 + 5);
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (bVar7);
  }
  (self->
  super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>).
  super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
  .currBasicBlock = pBVar4;
  pvVar11 = (self->
            super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            ).
            super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
            .throwingInstsStack.
            super__Vector_base<std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppBVar15 = pvVar11[-1].
             super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppBVar6 = pvVar11[-1].
            super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar15 != ppBVar6) {
    ppBVar10 = pvVar5[-1].
               super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppBVar13 = pvVar5[-1].
               super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (ppBVar13 != ppBVar10) {
        this = (CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                *)*ppBVar15;
        __to = (char *)0x0;
        pcVar16 = &DAT_00000001;
        do {
          link(this,(char *)ppBVar10[(long)__to],__to);
          ppBVar10 = pvVar5[-1].
                     super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppBVar13 = pvVar5[-1].
                     super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          bVar7 = pcVar16 < (char *)((long)ppBVar13 - (long)ppBVar10 >> 3);
          __to = pcVar16;
          pcVar16 = (char *)(ulong)((int)pcVar16 + 1);
        } while (bVar7);
      }
      ppBVar15 = ppBVar15 + 1;
    } while (ppBVar15 != ppBVar6);
    pvVar11 = (self->
              super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              ).
              super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
              .throwingInstsStack.
              super__Vector_base<std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  (self->
  super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>).
  super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
  .throwingInstsStack.
  super__Vector_base<std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar11 + -1;
  ppBVar15 = pvVar11[-1].
             super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppBVar15 != (pointer)0x0) {
    operator_delete(ppBVar15,(long)pvVar11[-1].
                                   super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppBVar15);
  }
  pppEVar2 = &(self->
              super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              ).
              super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
              .unwindExprStack.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppEVar2 = *pppEVar2 + -1;
  local_3c = 0;
  __position._M_current =
       (self->
       super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
       ).
       super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
       .catchIndexStack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (self->
      super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
      ).
      super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
      .catchIndexStack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&(self->
                super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                ).
                super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                .catchIndexStack,__position,&local_3c);
  }
  else {
    *__position._M_current = 0;
    (self->
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>).
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .catchIndexStack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

static void doStartCatches(SubType* self, Expression** currp) {
    self->tryStack.push_back(self->currBasicBlock); // last block of try body

    // Now that we are starting the catches, create the basic blocks that they
    // begin with.
    auto* last = self->currBasicBlock;
    auto* tryy = (*currp)->cast<Try>();
    self->processCatchStack.emplace_back();
    auto& entries = self->processCatchStack.back();
    for (Index i = 0; i < tryy->catchBodies.size(); i++) {
      entries.push_back(self->startBasicBlock());
    }
    self->currBasicBlock = last; // reset to the current block

    // Create links from things that reach those new basic blocks.
    auto& preds = self->throwingInstsStack.back();
    for (auto* pred : preds) {
      for (Index i = 0; i < entries.size(); i++) {
        self->link(pred, entries[i]);
      }
    }

    self->throwingInstsStack.pop_back();
    self->unwindExprStack.pop_back();
    self->catchIndexStack.push_back(0);
  }